

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O0

bool __thiscall
sf::priv::CursorImpl::loadFromPixels(CursorImpl *this,Uint8 *pixels,Vector2u size,Vector2u hotspot)

{
  byte bVar1;
  byte *pbVar2;
  undefined8 uVar3;
  reference pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined8 uVar5;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  XColor bg;
  XColor fg;
  Pixmap dataPixmap;
  Pixmap maskPixmap;
  Uint8 bit;
  int intensity;
  Uint8 opacity;
  size_t bitIndex;
  size_t byteIndex;
  size_t pixelIndex;
  size_t i;
  size_t j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mask;
  size_t bytes;
  CursorImpl *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffeb8;
  value_type_conflict3 *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed0;
  undefined1 local_e0 [8];
  undefined2 local_d8;
  undefined2 local_d6;
  undefined2 local_d4;
  undefined1 local_d0 [8];
  undefined2 local_c8;
  undefined2 local_c6;
  undefined2 local_c4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  undefined8 local_b8;
  undefined1 local_a9;
  uint local_a8;
  undefined1 local_a1;
  ulong local_a0;
  size_type local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  undefined1 local_71;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  ulong local_28;
  long local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  local_20 = in_RSI;
  local_10 = in_RCX;
  local_8 = in_RDX;
  release(in_stack_fffffffffffffeb0);
  local_28 = (ulong)(((int)local_8 + 7U >> 3) * local_8._4_4_);
  local_41 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x193fdf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x19400d);
  local_71 = 1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x194034);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x194062);
  for (local_80 = 0; local_80 < local_8 >> 0x20; local_80 = local_80 + 1) {
    for (local_88 = 0; local_88 < (local_8 & 0xffffffff); local_88 = local_88 + 1) {
      local_90 = local_88 + local_80 * (local_8 & 0xffffffff);
      local_98 = local_90 >> 3;
      local_a0 = local_88 & 7;
      local_a1 = *(char *)(local_20 + 3 + local_90 * 4) != '\0';
      bVar1 = local_a1 << (sbyte)local_a0;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_40,local_98);
      *pbVar2 = *pbVar2 | bVar1;
      local_a8 = (uint)*(byte *)(local_20 + local_90 * 4) +
                 (uint)*(byte *)(local_20 + 1 + local_90 * 4) +
                 (uint)*(byte *)(local_20 + 2 + local_90 * 4);
      local_a9 = 0x40 < local_a8;
      bVar1 = local_a9 << ((byte)local_a0 & 0x1f);
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_70,local_98);
      *pbVar2 = *pbVar2 | bVar1;
    }
  }
  uVar5 = *in_RDI;
  uVar3 = XDefaultRootWindow();
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
  local_b8 = XCreateBitmapFromData(uVar5,uVar3,pvVar4,local_8 & 0xffffffff,local_8._4_4_);
  uVar5 = *in_RDI;
  uVar3 = XDefaultRootWindow();
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_70,0);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            XCreateBitmapFromData(uVar5,uVar3,pvVar4,local_8 & 0xffffffff,local_8._4_4_);
  local_c6 = 0xffff;
  local_c4 = 0xffff;
  local_c8 = 0xffff;
  local_d6 = 0;
  local_d4 = 0;
  local_d8 = 0;
  local_c0 = this_00;
  uVar5 = XCreatePixmapCursor(*in_RDI,this_00,local_b8,local_d0,local_e0,local_10 & 0xffffffff,
                              local_10._4_4_);
  in_RDI[1] = uVar5;
  XFreePixmap(*in_RDI,local_c0);
  XFreePixmap(*in_RDI,local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return true;
}

Assistant:

bool CursorImpl::loadFromPixels(const Uint8* pixels, Vector2u size, Vector2u hotspot)
{
    release();

    // Convert the image into a bitmap (monochrome!).
    std::size_t bytes = (size.x + 7) / 8 * size.y;
    std::vector<Uint8> mask(bytes, 0); // Defines which pixel is transparent.
    std::vector<Uint8> data(bytes, 1); // Defines which pixel is white/black.

    for (std::size_t j = 0; j < size.y; ++j)
    {
        for (std::size_t i = 0; i < size.x; ++i)
        {
            std::size_t pixelIndex = i + j * size.x;
            std::size_t byteIndex  = pixelIndex / 8;
            std::size_t bitIndex   = i % 8;

            // Turn on pixel that are not transparent
            Uint8 opacity = pixels[pixelIndex * 4 + 3] > 0 ? 1 : 0;
            mask[byteIndex] |= opacity << bitIndex;

            // Choose between black/background & white/foreground color for each pixel,
            // based on the pixel color intensity: on average, if a channel is "active"
            // at 25%, the bit is white.
            int intensity = pixels[pixelIndex * 4 + 0] + pixels[pixelIndex * 4 + 1] + pixels[pixelIndex * 4 + 2];
            Uint8 bit = intensity > 64 ? 1 : 0;
            data[byteIndex] |= bit << bitIndex;
        }
    }

    Pixmap maskPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              (char*)&mask[0], size.x, size.y);
    Pixmap dataPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              (char*)&data[0], size.x, size.y);

    // Define the foreground color as white and the background as black.
    XColor fg, bg;
    fg.red = fg.blue = fg.green = -1;
    bg.red = bg.blue = bg.green =  0;

    // Create the monochrome cursor.
    m_cursor = XCreatePixmapCursor(m_display,
                                   dataPixmap, maskPixmap,
                                   &fg, &bg,
                                   hotspot.x, hotspot.y);

    // Free the resources
    XFreePixmap(m_display, dataPixmap);
    XFreePixmap(m_display, maskPixmap);

    // We assume everything went fine...
    return true;
}